

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 *pIVar5;
  ImGuiContext *ctx;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  float thickness;
  float fVar9;
  float fVar10;
  float fVar11;
  
  thickness = sz / 5.0;
  pIVar3 = GImGui->CurrentWindow;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar9 = sz - thickness * 0.5;
  fVar10 = fVar9 / 3.0;
  fVar11 = pos.x + thickness * 0.25 + fVar10;
  fVar9 = (pos.y + thickness * 0.25 + fVar9) - fVar10 * 0.5;
  pIVar4 = pIVar3->DrawList;
  iVar8 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar6;
      (pIVar4->_Path).Capacity = iVar8;
    }
  }
  pIVar5 = (pIVar4->_Path).Data;
  iVar8 = (pIVar4->_Path).Size;
  pIVar5[iVar8].x = fVar11 - fVar10;
  pIVar5[iVar8].y = fVar9 - fVar10;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  iVar8 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar6;
      (pIVar4->_Path).Capacity = iVar8;
    }
  }
  pIVar5 = (pIVar4->_Path).Data;
  iVar8 = (pIVar4->_Path).Size;
  pIVar5[iVar8].x = fVar11;
  pIVar5[iVar8].y = fVar9;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  iVar8 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar6 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar6;
      (pIVar4->_Path).Capacity = iVar8;
    }
  }
  pIVar5 = (pIVar4->_Path).Data;
  iVar8 = (pIVar4->_Path).Size;
  pIVar5[iVar8].x = fVar10 + fVar10 + fVar11;
  pIVar5[iVar8].y = -fVar10 + -fVar10 + fVar9;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  ImDrawList::AddPolyline(pIVar4,(pIVar4->_Path).Data,(pIVar4->_Path).Size,col,false,thickness);
  (pIVar4->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}